

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<std::__cxx11::string,unsigned_long>::
     construct<std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::pair<std::__cxx11::string_const,unsigned_long>const&>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                *alloc,slot_type *slot,
               pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *args)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *in_RDX;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  *in_RSI;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::emplace((slot_type *)0x1cc51c);
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>::
  construct<std::pair<std::__cxx11::string,unsigned_long>,std::pair<std::__cxx11::string_const,unsigned_long>const&>
            (in_RSI,in_RDX,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
              *)0x1cc52f);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args)
			{
				emplace(slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
					        std::forward<Args>(args)...);
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->value,
					        std::forward<Args>(args)...);
				}
			}